

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TZX.cpp
# Opt level: O0

void __thiscall Storage::Tape::TZX::get_next_pulses(TZX *this)

{
  bool bVar1;
  LogLine local_20;
  byte local_11;
  TZX *pTStack_10;
  uint8_t chunk_id;
  TZX *this_local;
  
  pTStack_10 = this;
  while( true ) {
    bVar1 = PulseQueuedTape::empty(&this->super_PulseQueuedTape);
    if (!bVar1) {
      return;
    }
    local_11 = FileHolder::get8(&this->file_);
    bVar1 = FileHolder::eof(&this->file_);
    if (bVar1) break;
    switch(local_11) {
    case 0x10:
      get_standard_speed_data_block(this);
      break;
    case 0x11:
      get_turbo_speed_data_block(this);
      break;
    case 0x12:
      get_pure_tone_data_block(this);
      break;
    case 0x13:
      get_pulse_sequence(this);
      break;
    case 0x14:
      get_pure_data_block(this);
      break;
    case 0x15:
      get_direct_recording_block(this);
      break;
    default:
      Log::Logger<(Log::Source)31>::error((Logger<(Log::Source)31> *)&local_20);
      Log::Logger<(Log::Source)31>::LogLine::append
                (&local_20,"Unknown TZX chunk: %04x",(ulong)local_11);
      Log::Logger<(Log::Source)31>::LogLine::~LogLine(&local_20);
      PulseQueuedTape::set_is_at_end(&this->super_PulseQueuedTape,true);
      return;
    case 0x18:
      get_csw_recording_block(this);
      break;
    case 0x19:
      get_generalised_data_block(this);
      break;
    case 0x20:
      get_pause(this);
      break;
    case 0x21:
      ignore_group_start(this);
      break;
    case 0x22:
      ignore_group_end(this);
      break;
    case 0x23:
      ignore_jump_to_block(this);
      break;
    case 0x24:
      ignore_loop_start(this);
      break;
    case 0x25:
      ignore_loop_end(this);
      break;
    case 0x26:
      ignore_call_sequence(this);
      break;
    case 0x27:
      ignore_return_from_sequence(this);
      break;
    case 0x28:
      ignore_select_block(this);
      break;
    case 0x2a:
      ignore_stop_tape_if_in_48kb_mode(this);
      break;
    case 0x2b:
      get_set_signal_level(this);
      break;
    case 0x30:
      ignore_text_description(this);
      break;
    case 0x31:
      ignore_message_block(this);
      break;
    case 0x32:
      ignore_archive_info(this);
      break;
    case 0x33:
      get_hardware_type(this);
      break;
    case 0x35:
      ignore_custom_info_block(this);
      break;
    case 0x4b:
      get_kansas_city_block(this);
      break;
    case 0x5a:
      ignore_glue_block(this);
    }
  }
  PulseQueuedTape::set_is_at_end(&this->super_PulseQueuedTape,true);
  return;
}

Assistant:

void TZX::get_next_pulses() {
	while(empty()) {
		uint8_t chunk_id = file_.get8();
		if(file_.eof()) {
			set_is_at_end(true);
			return;
		}

		switch(chunk_id) {
			case 0x10:	get_standard_speed_data_block();	break;
			case 0x11:	get_turbo_speed_data_block();		break;
			case 0x12:	get_pure_tone_data_block();			break;
			case 0x13:	get_pulse_sequence();				break;
			case 0x14:	get_pure_data_block();				break;
			case 0x15:	get_direct_recording_block();		break;
			case 0x18:	get_csw_recording_block();			break;
			case 0x19:	get_generalised_data_block();		break;
			case 0x20:	get_pause();						break;

			case 0x21:	ignore_group_start();				break;
			case 0x22:	ignore_group_end();					break;
			case 0x23:	ignore_jump_to_block();				break;
			case 0x24:	ignore_loop_start();				break;
			case 0x25:	ignore_loop_end();					break;
			case 0x26:	ignore_call_sequence();				break;
			case 0x27:	ignore_return_from_sequence();		break;
			case 0x28:	ignore_select_block();				break;
			case 0x2a:	ignore_stop_tape_if_in_48kb_mode();	break;

			case 0x2b:	get_set_signal_level();				break;

			case 0x30:	ignore_text_description();			break;
			case 0x31:	ignore_message_block();				break;
			case 0x32:	ignore_archive_info();				break;
			case 0x33:	get_hardware_type();				break;
			case 0x35:	ignore_custom_info_block();			break;

			case 0x4b:	get_kansas_city_block();			break;

			case 0x5a:	ignore_glue_block();				break;

			default:
				// In TZX each chunk has a different way of stating or implying its length,
				// so there is no route past an unimplemented chunk.
				logger.error().append("Unknown TZX chunk: %04x", chunk_id);
				set_is_at_end(true);
			return;
		}
	}
}